

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::SetWindowCollapsed(char *name,bool collapsed,ImGuiSetCond cond)

{
  ImGuiWindow *window;
  
  window = FindWindowByName(name);
  if (window != (ImGuiWindow *)0x0) {
    ::SetWindowCollapsed(window,collapsed,cond);
    return;
  }
  return;
}

Assistant:

void ImGui::SetWindowCollapsed(const char* name, bool collapsed, ImGuiSetCond cond)
{
    ImGuiWindow* window = FindWindowByName(name);
    if (window)
        SetWindowCollapsed(window, collapsed, cond);
}